

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::OptionSpecException::OptionSpecException(OptionSpecException *this,string *message)

{
  string *in_RSI;
  undefined8 *in_RDI;
  string *message_00;
  OptionException *in_stack_ffffffffffffffc0;
  string local_30;
  
  message_00 = &local_30;
  std::__cxx11::string::string((string *)message_00,in_RSI);
  OptionException::OptionException(in_stack_ffffffffffffffc0,message_00);
  std::__cxx11::string::~string((string *)&local_30);
  *in_RDI = &PTR__OptionSpecException_001a4cf0;
  return;
}

Assistant:

explicit OptionSpecException(const std::string& message)
    : OptionException(message)
    {
    }